

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerImpl::EncodeChannelMask
                  (Error *__return_storage_ptr__,ByteArray *aBuf,ChannelMask *aChannelMask)

{
  char cVar1;
  pointer pCVar2;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer pCVar3;
  char *to;
  string_view fmt;
  format_args args;
  writer write;
  writer local_b8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pCVar3 = (aChannelMask->
           super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (aChannelMask->
           super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar2) {
    do {
      if (0xfe < (ulong)((long)(pCVar3->mMasks).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar3->mMasks).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
        local_68.types_[0] = uint_type;
        from = "Channel Mask list is tool long (>={})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "Channel Mask list is tool long (>={})";
        local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
        local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_68.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_b8.handler_ = &local_68;
        local_68.context_.types_ = local_68.types_;
        do {
          cVar1 = *from;
          to = from;
          while (cVar1 != '{') {
            to = to + 1;
            if (to == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()(&local_b8,from,"");
              goto LAB_001c6cb9;
            }
            cVar1 = *to;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
          ::writer::operator()(&local_b8,from,to);
          from = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                           (to,"",&local_68);
        } while (from != "");
LAB_001c6cb9:
        local_68.types_[0] = 0xff;
        local_68._4_4_ = 0;
        fmt.size_ = 2;
        fmt.data_ = (char *)0x25;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_68;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b0,(v10 *)"Channel Mask list is tool long (>={})",fmt,args);
        local_90 = kInvalidArgs;
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        __return_storage_ptr__->mCode = local_90;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_b0._M_dataplus._M_p);
        return __return_storage_ptr__;
      }
      utils::Encode<unsigned_char>(aBuf,pCVar3->mPage);
      utils::Encode<unsigned_char>
                (aBuf,(char)*(undefined4 *)
                             &(pCVar3->mMasks).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                      (char)*(undefined4 *)
                             &(pCVar3->mMasks).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
                 (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (pCVar3->mMasks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (pCVar3->mMasks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeChannelMask(ByteArray &aBuf, const ChannelMask &aChannelMask)
{
    Error error;

    for (const auto &entry : aChannelMask)
    {
        VerifyOrExit(entry.mMasks.size() < tlv::kEscapeLength,
                     error = ERROR_INVALID_ARGS("Channel Mask list is tool long (>={})", tlv::kEscapeLength));

        utils::Encode(aBuf, entry.mPage);
        utils::Encode(aBuf, static_cast<uint8_t>(entry.mMasks.size()));
        aBuf.insert(aBuf.end(), entry.mMasks.begin(), entry.mMasks.end());
    }

exit:
    return error;
}